

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_read_date_time_zone_id(mg_session *session,mg_date_time_zone_id **date_time_zone_id)

{
  int iVar1;
  mg_date_time_zone_id *val;
  
  iVar1 = mg_session_check_struct_header(session,0xb3,'f');
  if (iVar1 == 0) {
    val = mg_date_time_zone_id_alloc(session->decoder_allocator);
    if (val == (mg_date_time_zone_id *)0x0) {
      mg_session_set_error(session,"out of memory");
      iVar1 = -3;
    }
    else {
      iVar1 = mg_session_read_integer(session,&val->seconds);
      if ((iVar1 == 0) && (iVar1 = mg_session_read_integer(session,&val->nanoseconds), iVar1 == 0))
      {
        mg_session_read_integer(session,&val->tz_id);
        *date_time_zone_id = val;
        return 0;
      }
      mg_allocator_free(session->decoder_allocator,val);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_date_time_zone_id(
    mg_session *session, mg_date_time_zone_id **date_time_zone_id) {
  MG_RETURN_IF_FAILED(mg_session_check_struct_header(
      session, (uint8_t)(MG_MARKER_TINY_STRUCT + 3),
      MG_SIGNATURE_DATE_TIME_ZONE_ID));
  mg_date_time_zone_id *date_time_zone_id_tmp =
      mg_date_time_zone_id_alloc(session->decoder_allocator);
  if (!date_time_zone_id_tmp) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;
  status = mg_session_read_integer(session, &date_time_zone_id_tmp->seconds);
  if (status != 0) {
    goto cleanup;
  }

  status =
      mg_session_read_integer(session, &date_time_zone_id_tmp->nanoseconds);
  if (status != 0) {
    goto cleanup;
  }

  status = mg_session_read_integer(session, &date_time_zone_id_tmp->tz_id);

  *date_time_zone_id = date_time_zone_id_tmp;
  return 0;

cleanup:
  mg_allocator_free(session->decoder_allocator, date_time_zone_id_tmp);
  return status;
}